

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmessagebox.cpp
# Opt level: O2

void __thiscall QMessageBox::setStandardButtons(QMessageBox *this,StandardButtons buttons)

{
  QMessageBoxPrivate *this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<QAbstractButton_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMessageBoxPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QDialogButtonBox::setStandardButtons
            ((QDialogButtonBox *)this_00->buttonBox,
             (StandardButtons)
             buttons.super_QFlagsStorageHelper<QMessageBox::StandardButton,_4>.
             super_QFlagsStorage<QMessageBox::StandardButton>.i);
  local_38.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.ptr = (QAbstractButton **)&DAT_aaaaaaaaaaaaaaaa;
  QDialogButtonBox::buttons
            ((QList<QAbstractButton_*> *)&local_38,(QDialogButtonBox *)this_00->buttonBox);
  bVar1 = QListSpecialMethodsBase<QAbstractButton*>::contains<QAbstractButton*>
                    ((QListSpecialMethodsBase<QAbstractButton*> *)&local_38,&this_00->escapeButton);
  if (!bVar1) {
    this_00->escapeButton = (QAbstractButton *)0x0;
  }
  bVar1 = QListSpecialMethodsBase<QAbstractButton*>::contains<QPushButton*>
                    ((QListSpecialMethodsBase<QAbstractButton*> *)&local_38,&this_00->defaultButton)
  ;
  if (!bVar1) {
    this_00->defaultButton = (QPushButton *)0x0;
  }
  this_00->autoAddOkButton = false;
  QMessageBoxPrivate::updateSize(this_00);
  QArrayDataPointer<QAbstractButton_*>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMessageBox::setStandardButtons(StandardButtons buttons)
{
    Q_D(QMessageBox);
    d->buttonBox->setStandardButtons(QDialogButtonBox::StandardButtons(int(buttons)));

    QList<QAbstractButton *> buttonList = d->buttonBox->buttons();
    if (!buttonList.contains(d->escapeButton))
        d->escapeButton = nullptr;
    if (!buttonList.contains(d->defaultButton))
        d->defaultButton = nullptr;
    d->autoAddOkButton = false;
    d->updateSize();
}